

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_lnx_ModuleEnumerator.cpp
# Opt level: O3

bool __thiscall
axl::sys::lnx::EnumeratorModulesParser::processModule
          (EnumeratorModulesParser *this,StringRef *name,size_t size,size_t useCount,
          ModuleState state,size_t offset)

{
  ListLink *pLVar1;
  ModuleDesc *pMVar2;
  ListLink *pLVar3;
  EVP_PKEY_CTX *src;
  ListLink *link;
  
  pMVar2 = (ModuleDesc *)operator_new(0x50);
  (pMVar2->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p = (C *)0x0;
  (pMVar2->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr =
       (BufHdr *)0x0;
  *(undefined8 *)
   ((long)&(pMVar2->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr + 1)
       = 0;
  *(undefined8 *)
   ((long)&(pMVar2->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length +
   1) = 0;
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
            (&pMVar2->m_name,(EVP_PKEY_CTX *)name,src);
  pMVar2->m_size = size;
  pMVar2->m_useCount = useCount;
  pMVar2->m_state = state;
  pMVar2->m_offset = offset;
  pLVar1 = (ListLink *)this->m_moduleList;
  pLVar3 = pLVar1->m_prev;
  (pMVar2->super_ListLink).m_next = (ListLink *)0x0;
  (pMVar2->super_ListLink).m_prev = pLVar3;
  if (pLVar3 == (ListLink *)0x0) {
    pLVar3 = pLVar1;
  }
  (((OwningListBase<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sys::lnx::ModuleDesc>_>
     *)&pLVar3->m_next)->
  super_ListBase<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>_>
  ).super_ListData<axl::sys::lnx::ModuleDesc>.m_head = pMVar2;
  pLVar1->m_prev = (ListLink *)pMVar2;
  pLVar1[1].m_next = (ListLink *)((long)&(pLVar1[1].m_next)->m_next + 1);
  return true;
}

Assistant:

bool
	processModule(
		const sl::StringRef& name,
		size_t size,
		size_t useCount,
		ModuleState state,
		size_t offset
	) {
		ModuleDesc* moduleDesc = new ModuleDesc;
		moduleDesc->m_name = name;
		moduleDesc->m_size = size;
		moduleDesc->m_useCount = useCount;
		moduleDesc->m_state = state;
		moduleDesc->m_offset = offset;
		m_moduleList->insertTail(moduleDesc);
		return true;
	}